

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

int duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<double,int>
              (double input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  int iVar2;
  PhysicalType type;
  PhysicalType type_00;
  int output;
  double local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_128 = input;
  bVar1 = NumericTryCast::Operation<double,int>(input,&output,false);
  if (!bVar1) {
    TypeIdToString_abi_cxx11_(&local_40,(duckdb *)0xc,type);
    ::std::operator+(&local_c0,"Type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40)
    ;
    ::std::operator+(&local_a0,&local_c0," with value ");
    ConvertToString::Operation<double>(&local_e0,local_128);
    ::std::operator+(&local_80,&local_a0,&local_e0);
    ::std::operator+(&local_60,&local_80,
                     " can\'t be cast because the value is out of range for the destination type ");
    TypeIdToString_abi_cxx11_(&local_100,(duckdb *)0x7,type_00);
    ::std::operator+(&local_120,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                    );
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_40);
    iVar2 = HandleVectorCastError::Operation<int>(&local_120,mask,idx,(VectorTryCastData *)dataptr);
    ::std::__cxx11::string::~string((string *)&local_120);
    output = iVar2;
  }
  return output;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}